

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

void check_string(string *s)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte *pbVar9;
  char *pcVar10;
  runtime_error *this;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ostream *poVar14;
  long lVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  byte bVar21;
  int iVar22;
  byte *pbVar23;
  byte *pbVar24;
  byte *pbVar25;
  byte *ptr;
  long lVar26;
  bool bVar27;
  double x;
  double local_40;
  double local_38;
  
  ptr = (byte *)(s->_M_dataplus)._M_p;
  bVar1 = *ptr;
  pbVar9 = ptr;
  bVar16 = bVar1;
  if (bVar1 == 0x2d) {
    bVar16 = ptr[1];
    if ((byte)(bVar16 - 0x30) < 10) {
      pbVar9 = ptr + 1;
      goto LAB_00102a49;
    }
  }
  else {
LAB_00102a49:
    if (bVar16 == 0x30) {
      bVar21 = pbVar9[1];
      if (9 < (byte)(bVar21 - 0x30)) {
        pbVar24 = pbVar9 + 1;
        uVar20 = 0;
LAB_00102a65:
        if (bVar21 == 0x2e) {
          bVar17 = pbVar24[1] - 0x30;
          if (9 < bVar17) goto LAB_00102bfa;
          pbVar23 = pbVar24 + 1;
          lVar26 = 0;
          pbVar24 = pbVar23;
          do {
            uVar20 = (ulong)bVar17 + uVar20 * 10;
            bVar21 = pbVar24[1];
            pbVar24 = pbVar24 + 1;
            bVar17 = bVar21 - 0x30;
            lVar26 = lVar26 + -1;
          } while (bVar17 < 10);
          iVar22 = (int)pbVar23 - (int)lVar26;
        }
        else {
          lVar26 = 0;
          iVar22 = (int)pbVar24;
        }
        if ((bVar21 | 0x20) == 0x65) {
          bVar27 = (pbVar24[1] - 0x2b & 0xfd) == 0;
          pbVar23 = pbVar24 + 1;
          if (bVar27) {
            pbVar23 = pbVar24 + 2;
          }
          bVar21 = pbVar24[(ulong)bVar27 + 1] - 0x30;
          if (9 < bVar21) goto LAB_00102bfa;
          bVar17 = pbVar23[1] - 0x30;
          uVar13 = (ulong)bVar21 * 10 + (ulong)bVar17;
          if (9 < bVar17) {
            uVar13 = (ulong)bVar21;
          }
          pbVar25 = pbVar23 + 2;
          if (9 < bVar17) {
            pbVar25 = pbVar23 + 1;
          }
          bVar21 = pbVar23[(ulong)(bVar17 < 10) + 1] - 0x30;
          pbVar25 = pbVar25 + (bVar21 < 10);
          uVar12 = uVar13 * 10 + (ulong)bVar21;
          if (9 < bVar21) {
            uVar12 = uVar13;
          }
          for (; (byte)(*pbVar25 - 0x30) < 10; pbVar25 = pbVar25 + 1) {
            if ((long)uVar12 < 0x100000000) {
              uVar12 = (ulong)(byte)(*pbVar25 - 0x30) + uVar12 * 10;
            }
          }
          uVar13 = -uVar12;
          if (pbVar24[1] != 0x2d) {
            uVar13 = uVar12;
          }
          lVar26 = lVar26 + uVar13;
        }
        if ((int)(~(uint)pbVar9 + iVar22) < 0x13) {
LAB_00102bd4:
          if (lVar26 - 0x135U < 0xfffffffffffffd86) goto LAB_00102be3;
          if ((uVar20 >> 0x35 == 0) && (lVar26 + 0x16U < 0x2d)) {
            if (lVar26 < 0) {
              x = (double)(long)uVar20 /
                  *(double *)
                   (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                    power_of_ten + lVar26 * -8);
            }
            else {
              x = (double)(long)uVar20 *
                  *(double *)
                   (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                    power_of_ten + lVar26 * 8);
            }
            if (bVar1 == 0x2d) {
              x = -x;
            }
          }
          else {
            if (uVar20 != 0) {
              uVar13 = 0x3f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              uVar20 = uVar20 << ((byte)(uVar13 ^ 0x3f) & 0x3f);
              auVar2._8_8_ = 0;
              auVar2._0_8_ = uVar20;
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(fast_double_parser::
                                        compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64
                                       + lVar26 * 8 + 0xa28);
              auVar2 = auVar2 * auVar4;
              uVar11 = auVar2._0_8_;
              uVar12 = auVar2._8_8_ & 0x1ff;
              if ((uVar12 == 0x1ff) && (uVar12 = 0x1ff, CARRY8(uVar11,uVar20))) {
                auVar3._8_8_ = 0;
                auVar3._0_8_ = uVar20;
                auVar5._8_8_ = 0;
                auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                          compute_float_64(long,unsigned_long,bool,bool*)::
                                          mantissa_128 + lVar26 * 8 + 0xa28);
                uVar19 = SUB168(auVar3 * auVar5,8);
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar19;
                auVar6._8_8_ = 0;
                auVar6._0_8_ = uVar19;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = uVar19;
                auVar7 = auVar2 + auVar7;
                auVar6 = auVar2 + auVar6;
                uVar18 = auVar2._8_4_ + (uint)CARRY8(uVar11,uVar19) & 0x1ff;
                uVar12 = (ulong)uVar18;
                auVar2 = auVar2 + auVar8;
                if ((!CARRY8(SUB168(auVar3 * auVar5,0),uVar20)) ||
                   ((auVar2 = auVar6, uVar11 + uVar19 != -1 || (auVar2 = auVar7, uVar18 != 0x1ff))))
                goto LAB_00102ca3;
              }
              else {
LAB_00102ca3:
                uVar20 = auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f);
                uVar18 = (uint)uVar20;
                if ((auVar2._0_8_ != 0) || ((uVar12 != 0 || ((uVar18 & 3) != 1)))) {
                  uVar20 = (uVar18 & 1) + uVar20;
                  uVar12 = uVar20 >> 0x36;
                  uVar13 = ((lVar26 * 0x3526a >> 0x10) + 0x43f) -
                           ((auVar2._8_8_ >> 0x3f ^ 1) + (uVar13 ^ 0x3f) + -1 + (ulong)(uVar12 == 0)
                           );
                  if ((uVar13 != 0) && (uVar13 < 0x7ff)) {
                    uVar11 = 0;
                    if (uVar12 == 0) {
                      uVar11 = uVar20 >> 1 & 0xefffffffffffff;
                    }
                    x = (double)((ulong)(bVar1 == 0x2d) << 0x3f | uVar11 | uVar13 << 0x34);
                    goto LAB_00102d81;
                  }
                }
              }
              x = 0.0;
              goto LAB_00102be3;
            }
            if (bVar1 == 0x2d) {
              x = -0.0;
            }
            else {
              x = 0.0;
            }
          }
        }
        else {
          lVar15 = 1;
          while ((bVar16 == 0x30 || (bVar16 == 0x2e))) {
            pbVar24 = pbVar9 + lVar15;
            lVar15 = lVar15 + 1;
            bVar16 = *pbVar24;
          }
          if ((int)((iVar22 - (uint)pbVar9) - (int)lVar15) < 0x13) goto LAB_00102bd4;
LAB_00102be3:
          pcVar10 = fast_double_parser::parse_float_strtod((char *)ptr,&x);
          if (pcVar10 == (char *)0x0) {
            ptr = (byte *)(s->_M_dataplus)._M_p;
            goto LAB_00102bfa;
          }
        }
LAB_00102d81:
        if ((check_string(std::__cxx11::string)::c_locale == '\0') &&
           (iVar22 = __cxa_guard_acquire(&check_string(std::__cxx11::string)::c_locale), iVar22 != 0
           )) {
          check_string::c_locale = (locale_t)newlocale(0x1fbf,"C",(__locale_t)0x0);
          __cxa_guard_release(&check_string(std::__cxx11::string)::c_locale);
        }
        local_38 = strtod_l((s->_M_dataplus)._M_p,(char **)0x0,(__locale_t)check_string::c_locale);
        if ((local_38 == x) && (!NAN(local_38) && !NAN(x))) {
          return;
        }
        local_40 = x;
        poVar14 = std::operator<<((ostream *)&std::cerr,"fast_double_parser disagrees");
        std::endl<char,std::char_traits<char>>(poVar14);
        printf("fast_double_parser: %.*e\n",local_40,0x10);
        printf("reference: %.*e\n",local_38,0x10);
        printf("string: %s\n",(s->_M_dataplus)._M_p);
        if ((long)((ulong)local_40 ^ (ulong)local_38) < 0) {
          lVar26 = (long)local_38 + (long)local_40 + 0x80000000;
        }
        else {
          lVar15 = (long)local_40 - (long)local_38;
          lVar26 = -lVar15;
          if (0 < lVar15) {
            lVar26 = lVar15;
          }
        }
        printf("f64_ulp_dist = %d\n",lVar26);
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"fast_double_parser disagrees");
        goto LAB_00102f4d;
      }
    }
    else if ((byte)(bVar16 - 0x30) < 10) {
      uVar20 = (ulong)(byte)(bVar16 - 0x30);
      pbVar24 = pbVar9;
      while( true ) {
        pbVar24 = pbVar24 + 1;
        bVar21 = *pbVar24;
        if (9 < (byte)(bVar21 - 0x30)) break;
        uVar20 = (ulong)(byte)(bVar21 - 0x30) + uVar20 * 10;
      }
      goto LAB_00102a65;
    }
  }
LAB_00102bfa:
  printf("fast_double_parser refused to parse %s\n",ptr);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"fast_double_parser refused to parse");
LAB_00102f4d:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check_string(std::string s) {
  double x;
  bool isok = fast_double_parser::parse_number(s.data(), &x);
  if (!isok) {
    printf("fast_double_parser refused to parse %s\n", s.c_str());
    throw std::runtime_error("fast_double_parser refused to parse");
  }
#if defined(FAST_DOUBLE_PARSER_SOLARIS) || defined(FAST_DOUBLE_PARSER_CYGWIN) 
  // workround for cygwin, solaris
  char *endptr;
  double d = cygwin_strtod_l(s.data(), &endptr);
#elif defined(_WIN32)
  static _locale_t c_locale = _create_locale(LC_ALL, "C");
  double d = _strtod_l(s.data(), nullptr, c_locale);
#else
  static locale_t c_locale = newlocale(LC_ALL_MASK, "C", NULL);
  double d = strtod_l(s.data(), nullptr, c_locale);
#endif
  if (d != x) {
    std::cerr << "fast_double_parser disagrees" << std::endl;
    printf("fast_double_parser: %.*e\n", DBL_DIG + 1, x);
    printf("reference: %.*e\n", DBL_DIG + 1, d);
    printf("string: %s\n", s.c_str());
    printf("f64_ulp_dist = %d\n", (int)f64_ulp_dist(x, d));
    throw std::runtime_error("fast_double_parser disagrees");
  }
}